

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_pathway.c
# Opt level: O0

greatest_test_res pathway_compare(void)

{
  int iVar1;
  greatest_test_res gVar2;
  undefined1 local_1ac0 [8];
  pathway_t n;
  pathway_t m;
  pathway_t l;
  pathway_t k;
  pathway_t j;
  pathway_t i;
  pathway_t h;
  pathway_t g;
  pathway_t f;
  pathway_t e;
  pathway_t d;
  pathway_t c;
  pathway_t b;
  pathway_t a;
  
  memcpy(b.reversed_signposted_as + 0x78,"INDEX456_abc",0x1e8);
  memcpy(c.reversed_signposted_as + 0x78,"INDEX456_abc",0x1e8);
  memcpy(d.reversed_signposted_as + 0x78,"INDEX457_abc",0x1e8);
  memcpy(e.reversed_signposted_as + 0x78,"INDEX456_abc",0x1e8);
  memcpy(f.reversed_signposted_as + 0x78,"INDEX456_abc",0x1e8);
  memcpy(g.reversed_signposted_as + 0x78,"INDEX456_abc",0x1e8);
  memcpy(h.reversed_signposted_as + 0x78,"INDEX456_abc",0x1e8);
  memcpy(i.reversed_signposted_as + 0x78,"INDEX456_abc",0x1e8);
  memcpy(j.reversed_signposted_as + 0x78,"INDEX456_abc",0x1e8);
  memcpy(k.reversed_signposted_as + 0x78,"INDEX456_abc",0x1e8);
  memcpy(l.reversed_signposted_as + 0x78,"INDEX456_abc",0x1e8);
  memcpy(m.reversed_signposted_as + 0x78,"INDEX456_abc",0x1e8);
  memcpy(n.reversed_signposted_as + 0x78,"INDEX456_abc",0x1e8);
  memcpy(local_1ac0,"INDEX456_abc",0x1e8);
  greatest_info.assertions = greatest_info.assertions + 1;
  iVar1 = equal_pathway((pathway_t *)(b.reversed_signposted_as + 0x78),
                        (pathway_t *)(c.reversed_signposted_as + 0x78));
  if (iVar1 == 1) {
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_pathway((pathway_t *)(b.reversed_signposted_as + 0x78),
                          (pathway_t *)(d.reversed_signposted_as + 0x78));
    if (iVar1 == 0) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_pathway((pathway_t *)(c.reversed_signposted_as + 0x78),
                            (pathway_t *)(d.reversed_signposted_as + 0x78));
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_pathway((pathway_t *)(c.reversed_signposted_as + 0x78),
                              (pathway_t *)(e.reversed_signposted_as + 0x78));
        if (iVar1 == 0) {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = equal_pathway((pathway_t *)(c.reversed_signposted_as + 0x78),
                                (pathway_t *)(f.reversed_signposted_as + 0x78));
          if (iVar1 == 0) {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_pathway((pathway_t *)(c.reversed_signposted_as + 0x78),
                                  (pathway_t *)(g.reversed_signposted_as + 0x78));
            if (iVar1 == 0) {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_pathway((pathway_t *)(c.reversed_signposted_as + 0x78),
                                    (pathway_t *)(h.reversed_signposted_as + 0x78));
              if (iVar1 == 0) {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar1 = equal_pathway((pathway_t *)(c.reversed_signposted_as + 0x78),
                                      (pathway_t *)(i.reversed_signposted_as + 0x78));
                if (iVar1 == 0) {
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar1 = equal_pathway((pathway_t *)(c.reversed_signposted_as + 0x78),
                                        (pathway_t *)(j.reversed_signposted_as + 0x78));
                  if (iVar1 == 0) {
                    greatest_info.assertions = greatest_info.assertions + 1;
                    iVar1 = equal_pathway((pathway_t *)(c.reversed_signposted_as + 0x78),
                                          (pathway_t *)(k.reversed_signposted_as + 0x78));
                    if (iVar1 == 0) {
                      greatest_info.assertions = greatest_info.assertions + 1;
                      iVar1 = equal_pathway((pathway_t *)(c.reversed_signposted_as + 0x78),
                                            (pathway_t *)(l.reversed_signposted_as + 0x78));
                      if (iVar1 == 0) {
                        greatest_info.assertions = greatest_info.assertions + 1;
                        iVar1 = equal_pathway((pathway_t *)(c.reversed_signposted_as + 0x78),
                                              (pathway_t *)(m.reversed_signposted_as + 0x78));
                        if (iVar1 == 0) {
                          greatest_info.assertions = greatest_info.assertions + 1;
                          iVar1 = equal_pathway((pathway_t *)(c.reversed_signposted_as + 0x78),
                                                (pathway_t *)(n.reversed_signposted_as + 0x78));
                          if (iVar1 == 0) {
                            greatest_info.assertions = greatest_info.assertions + 1;
                            iVar1 = equal_pathway((pathway_t *)(c.reversed_signposted_as + 0x78),
                                                  (pathway_t *)local_1ac0);
                            if (iVar1 == 0) {
                              greatest_info.msg = (char *)0x0;
                              a.reversed_signposted_as[0x7c] = '\0';
                              a.reversed_signposted_as[0x7d] = '\0';
                              a.reversed_signposted_as[0x7e] = '\0';
                              a.reversed_signposted_as[0x7f] = '\0';
                            }
                            else {
                              greatest_info.fail_file =
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
                              ;
                              greatest_info.fail_line = 0x106;
                              greatest_info.msg = "0 != equal_pathway(&b, &n)";
                              if ((greatest_info.flags & 4) != 0) {
                                abort();
                              }
                              a.reversed_signposted_as[0x7c] = -1;
                              a.reversed_signposted_as[0x7d] = -1;
                              a.reversed_signposted_as[0x7e] = -1;
                              a.reversed_signposted_as[0x7f] = -1;
                            }
                          }
                          else {
                            greatest_info.fail_file =
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
                            ;
                            greatest_info.fail_line = 0x105;
                            greatest_info.msg = "0 != equal_pathway(&b, &m)";
                            if ((greatest_info.flags & 4) != 0) {
                              abort();
                            }
                            a.reversed_signposted_as[0x7c] = -1;
                            a.reversed_signposted_as[0x7d] = -1;
                            a.reversed_signposted_as[0x7e] = -1;
                            a.reversed_signposted_as[0x7f] = -1;
                          }
                        }
                        else {
                          greatest_info.fail_file =
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
                          ;
                          greatest_info.fail_line = 0x104;
                          greatest_info.msg = "0 != equal_pathway(&b, &l)";
                          if ((greatest_info.flags & 4) != 0) {
                            abort();
                          }
                          a.reversed_signposted_as[0x7c] = -1;
                          a.reversed_signposted_as[0x7d] = -1;
                          a.reversed_signposted_as[0x7e] = -1;
                          a.reversed_signposted_as[0x7f] = -1;
                        }
                      }
                      else {
                        greatest_info.fail_file =
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
                        ;
                        greatest_info.fail_line = 0x103;
                        greatest_info.msg = "0 != equal_pathway(&b, &k)";
                        if ((greatest_info.flags & 4) != 0) {
                          abort();
                        }
                        a.reversed_signposted_as[0x7c] = -1;
                        a.reversed_signposted_as[0x7d] = -1;
                        a.reversed_signposted_as[0x7e] = -1;
                        a.reversed_signposted_as[0x7f] = -1;
                      }
                    }
                    else {
                      greatest_info.fail_file =
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
                      ;
                      greatest_info.fail_line = 0x102;
                      greatest_info.msg = "0 != equal_pathway(&b, &j)";
                      if ((greatest_info.flags & 4) != 0) {
                        abort();
                      }
                      a.reversed_signposted_as[0x7c] = -1;
                      a.reversed_signposted_as[0x7d] = -1;
                      a.reversed_signposted_as[0x7e] = -1;
                      a.reversed_signposted_as[0x7f] = -1;
                    }
                  }
                  else {
                    greatest_info.fail_file =
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
                    ;
                    greatest_info.fail_line = 0x101;
                    greatest_info.msg = "0 != equal_pathway(&b, &i)";
                    if ((greatest_info.flags & 4) != 0) {
                      abort();
                    }
                    a.reversed_signposted_as[0x7c] = -1;
                    a.reversed_signposted_as[0x7d] = -1;
                    a.reversed_signposted_as[0x7e] = -1;
                    a.reversed_signposted_as[0x7f] = -1;
                  }
                }
                else {
                  greatest_info.fail_file =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
                  ;
                  greatest_info.fail_line = 0x100;
                  greatest_info.msg = "0 != equal_pathway(&b, &h)";
                  if ((greatest_info.flags & 4) != 0) {
                    abort();
                  }
                  a.reversed_signposted_as[0x7c] = -1;
                  a.reversed_signposted_as[0x7d] = -1;
                  a.reversed_signposted_as[0x7e] = -1;
                  a.reversed_signposted_as[0x7f] = -1;
                }
              }
              else {
                greatest_info.fail_file =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
                ;
                greatest_info.fail_line = 0xff;
                greatest_info.msg = "0 != equal_pathway(&b, &g)";
                if ((greatest_info.flags & 4) != 0) {
                  abort();
                }
                a.reversed_signposted_as[0x7c] = -1;
                a.reversed_signposted_as[0x7d] = -1;
                a.reversed_signposted_as[0x7e] = -1;
                a.reversed_signposted_as[0x7f] = -1;
              }
            }
            else {
              greatest_info.fail_file =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
              ;
              greatest_info.fail_line = 0xfe;
              greatest_info.msg = "0 != equal_pathway(&b, &f)";
              if ((greatest_info.flags & 4) != 0) {
                abort();
              }
              a.reversed_signposted_as[0x7c] = -1;
              a.reversed_signposted_as[0x7d] = -1;
              a.reversed_signposted_as[0x7e] = -1;
              a.reversed_signposted_as[0x7f] = -1;
            }
          }
          else {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
            ;
            greatest_info.fail_line = 0xfd;
            greatest_info.msg = "0 != equal_pathway(&b, &e)";
            if ((greatest_info.flags & 4) != 0) {
              abort();
            }
            a.reversed_signposted_as[0x7c] = -1;
            a.reversed_signposted_as[0x7d] = -1;
            a.reversed_signposted_as[0x7e] = -1;
            a.reversed_signposted_as[0x7f] = -1;
          }
        }
        else {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
          ;
          greatest_info.fail_line = 0xfc;
          greatest_info.msg = "0 != equal_pathway(&b, &d)";
          if ((greatest_info.flags & 4) != 0) {
            abort();
          }
          a.reversed_signposted_as[0x7c] = -1;
          a.reversed_signposted_as[0x7d] = -1;
          a.reversed_signposted_as[0x7e] = -1;
          a.reversed_signposted_as[0x7f] = -1;
        }
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
        ;
        greatest_info.fail_line = 0xfb;
        greatest_info.msg = "0 != equal_pathway(&b, &c)";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        a.reversed_signposted_as[0x7c] = -1;
        a.reversed_signposted_as[0x7d] = -1;
        a.reversed_signposted_as[0x7e] = -1;
        a.reversed_signposted_as[0x7f] = -1;
      }
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
      ;
      greatest_info.fail_line = 0xfa;
      greatest_info.msg = "0 != equal_pathway(&a, &c)";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      a.reversed_signposted_as[0x7c] = -1;
      a.reversed_signposted_as[0x7d] = -1;
      a.reversed_signposted_as[0x7e] = -1;
      a.reversed_signposted_as[0x7f] = -1;
    }
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
    ;
    greatest_info.fail_line = 0xf9;
    greatest_info.msg = "1 != equal_pathway(&a, &b)";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    a.reversed_signposted_as[0x7c] = -1;
    a.reversed_signposted_as[0x7d] = -1;
    a.reversed_signposted_as[0x7e] = -1;
    a.reversed_signposted_as[0x7f] = -1;
  }
  gVar2._0_1_ = a.reversed_signposted_as[0x7c];
  gVar2._1_1_ = a.reversed_signposted_as[0x7d];
  gVar2._2_1_ = a.reversed_signposted_as[0x7e];
  gVar2._3_1_ = a.reversed_signposted_as[0x7f];
  return gVar2;
}

Assistant:

TEST pathway_compare(void) {
    pathway_t a = {
        .id = "INDEX456_abc",
        .from_stop_id = "STOP_ID1",
        .to_stop_id = "STOP_ID2",
        .mode = PTMD_MOVING,
        .is_bidirectional = PD_BIDIRECTIONAL,
        .length = 123.4,
        .traversal_time = 3600,
        .stair_count = 12,
        .max_slope = -1.008,
        .min_width = 2.3,
        .signposted_as = "Something A",
        .reversed_signposted_as = "Something B"
    };

    pathway_t b = {
        .id = "INDEX456_abc",
        .from_stop_id = "STOP_ID1",
        .to_stop_id = "STOP_ID2",
        .mode = PTMD_MOVING,
        .is_bidirectional = PD_BIDIRECTIONAL,
        .length = 123.4,
        .traversal_time = 3600,
        .stair_count = 12,
        .max_slope = -1.008,
        .min_width = 2.3,
        .signposted_as = "Something A",
        .reversed_signposted_as = "Something B"
    };

    pathway_t c = {
        .id = "INDEX457_abc",
        .from_stop_id = "STOP_ID1",
        .to_stop_id = "STOP_ID2",
        .mode = PTMD_MOVING,
        .is_bidirectional = PD_BIDIRECTIONAL,
        .length = 123.4,
        .traversal_time = 3600,
        .stair_count = 12,
        .max_slope = -1.008,
        .min_width = 2.3,
        .signposted_as = "Something A",
        .reversed_signposted_as = "Something B"
    };

    pathway_t d = {
        .id = "INDEX456_abc",
        .from_stop_id = "STOP_ID",
        .to_stop_id = "STOP_ID2",
        .mode = PTMD_MOVING,
        .is_bidirectional = PD_BIDIRECTIONAL,
        .length = 123.4,
        .traversal_time = 3600,
        .stair_count = 12,
        .max_slope = -1.008,
        .min_width = 2.3,
        .signposted_as = "Something A",
        .reversed_signposted_as = "Something B"
    };

    pathway_t e = {
        .id = "INDEX456_abc",
        .from_stop_id = "STOP_ID1",
        .to_stop_id = "STOP_ID23",
        .mode = PTMD_MOVING,
        .is_bidirectional = PD_BIDIRECTIONAL,
        .length = 123.4,
        .traversal_time = 3600,
        .stair_count = 12,
        .max_slope = -1.008,
        .min_width = 2.3,
        .signposted_as = "Something A",
        .reversed_signposted_as = "Something B"
    };

    pathway_t f = {
        .id = "INDEX456_abc",
        .from_stop_id = "STOP_ID1",
        .to_stop_id = "STOP_ID2",
        .mode = PTMD_EXITGATE,
        .is_bidirectional = PD_BIDIRECTIONAL,
        .length = 123.4,
        .traversal_time = 3600,
        .stair_count = 12,
        .max_slope = -1.008,
        .min_width = 2.3,
        .signposted_as = "Something A",
        .reversed_signposted_as = "Something B"
    };

    pathway_t g = {
        .id = "INDEX456_abc",
        .from_stop_id = "STOP_ID1",
        .to_stop_id = "STOP_ID2",
        .mode = PTMD_MOVING,
        .is_bidirectional = PD_UNIDIRECTIONAL,
        .length = 123.4,
        .traversal_time = 3600,
        .stair_count = 12,
        .max_slope = -1.008,
        .min_width = 2.3,
        .signposted_as = "Something A",
        .reversed_signposted_as = "Something B"
    };

    pathway_t h = {
        .id = "INDEX456_abc",
        .from_stop_id = "STOP_ID1",
        .to_stop_id = "STOP_ID2",
        .mode = PTMD_MOVING,
        .is_bidirectional = PD_BIDIRECTIONAL,
        .length = 123.0,
        .traversal_time = 3600,
        .stair_count = 12,
        .max_slope = -1.008,
        .min_width = 2.3,
        .signposted_as = "Something A",
        .reversed_signposted_as = "Something B"
    };

    pathway_t i = {
        .id = "INDEX456_abc",
        .from_stop_id = "STOP_ID1",
        .to_stop_id = "STOP_ID2",
        .mode = PTMD_MOVING,
        .is_bidirectional = PD_BIDIRECTIONAL,
        .length = 123.4,
        .traversal_time = 0,
        .stair_count = 12,
        .max_slope = -1.008,
        .min_width = 2.3,
        .signposted_as = "Something A",
        .reversed_signposted_as = "Something B"
    };

    pathway_t j = {
        .id = "INDEX456_abc",
        .from_stop_id = "STOP_ID1",
        .to_stop_id = "STOP_ID2",
        .mode = PTMD_MOVING,
        .is_bidirectional = PD_BIDIRECTIONAL,
        .length = 123.4,
        .traversal_time = 3600,
        .stair_count = 1,
        .max_slope = -1.008,
        .min_width = 2.3,
        .signposted_as = "Something A",
        .reversed_signposted_as = "Something B"
    };

    pathway_t k = {
        .id = "INDEX456_abc",
        .from_stop_id = "STOP_ID1",
        .to_stop_id = "STOP_ID2",
        .mode = PTMD_MOVING,
        .is_bidirectional = PD_BIDIRECTIONAL,
        .length = 123.4,
        .traversal_time = 3600,
        .stair_count = 12,
        .max_slope = -1,
        .min_width = 2.3,
        .signposted_as = "Something A",
        .reversed_signposted_as = "Something B"
    };

    pathway_t l = {
        .id = "INDEX456_abc",
        .from_stop_id = "STOP_ID1",
        .to_stop_id = "STOP_ID2",
        .mode = PTMD_MOVING,
        .is_bidirectional = PD_BIDIRECTIONAL,
        .length = 123.4,
        .traversal_time = 3600,
        .stair_count = 12,
        .max_slope = -1.008,
        .min_width = 0.4,
        .signposted_as = "Something A",
        .reversed_signposted_as = "Something B"
    };

    pathway_t m = {
        .id = "INDEX456_abc",
        .from_stop_id = "STOP_ID1",
        .to_stop_id = "STOP_ID2",
        .mode = PTMD_MOVING,
        .is_bidirectional = PD_BIDIRECTIONAL,
        .length = 123.4,
        .traversal_time = 3600,
        .stair_count = 12,
        .max_slope = -1.008,
        .min_width = 2.3,
        .signposted_as = "Something XY",
        .reversed_signposted_as = "Something B"
    };

    pathway_t n = {
        .id = "INDEX456_abc",
        .from_stop_id = "STOP_ID1",
        .to_stop_id = "STOP_ID2",
        .mode = PTMD_MOVING,
        .is_bidirectional = PD_BIDIRECTIONAL,
        .length = 123.4,
        .traversal_time = 3600,
        .stair_count = 12,
        .max_slope = -1.008,
        .min_width = 2.3,
        .signposted_as = "Something A",
        .reversed_signposted_as = "Something YZ"
    };

    ASSERT_EQ(1, equal_pathway(&a, &b));
    ASSERT_EQ(0, equal_pathway(&a, &c));
    ASSERT_EQ(0, equal_pathway(&b, &c));
    ASSERT_EQ(0, equal_pathway(&b, &d));
    ASSERT_EQ(0, equal_pathway(&b, &e));
    ASSERT_EQ(0, equal_pathway(&b, &f));
    ASSERT_EQ(0, equal_pathway(&b, &g));
    ASSERT_EQ(0, equal_pathway(&b, &h));
    ASSERT_EQ(0, equal_pathway(&b, &i));
    ASSERT_EQ(0, equal_pathway(&b, &j));
    ASSERT_EQ(0, equal_pathway(&b, &k));
    ASSERT_EQ(0, equal_pathway(&b, &l));
    ASSERT_EQ(0, equal_pathway(&b, &m));
    ASSERT_EQ(0, equal_pathway(&b, &n));

    PASS();
}